

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

HierarchicalInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::HierarchicalInstanceSyntax_const&>
          (BumpAllocator *this,HierarchicalInstanceSyntax *args)

{
  HierarchicalInstanceSyntax *pHVar1;
  HierarchicalInstanceSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pHVar1 = (HierarchicalInstanceSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::HierarchicalInstanceSyntax::HierarchicalInstanceSyntax(in_RSI,pHVar1);
  return pHVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }